

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Exception::Exception(Exception *this,string *msg)

{
  *(undefined ***)this = &PTR__Exception_00121b28;
  std::__cxx11::string::string((string *)&this->msg_,(string *)msg);
  return;
}

Assistant:

Exception::Exception(std::string const& msg)
  : msg_(msg)
{}